

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O1

iterator __thiscall
QMap<QByteArray,_QByteArray>::insert
          (QMap<QByteArray,_QByteArray> *this,const_iterator pos,QByteArray *key,QByteArray *value)

{
  QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
  *pQVar1;
  const_iterator cVar2;
  iterator iVar3;
  long lVar4;
  long in_FS_OFFSET;
  QMap<QByteArray,_QByteArray> copy;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
  local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 == (QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
                  *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value == (__atomic_base<int>)0x1)) {
    local_38.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_*>
          )(QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
            *)0x0;
  }
  else {
    local_38.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_*>
          )(this->d).d.ptr;
    if (local_38.d.ptr !=
        (QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
         *)0x0) {
      LOCK();
      (((QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
         *)local_38.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value =
           (Type)((int)(((QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
                          *)local_38.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value + 1);
      UNLOCK();
    }
  }
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 == (QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
                 *)0x0) {
LAB_0011024d:
    lVar4 = 0;
  }
  else {
    if ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value == (__atomic_base<int>)0x1) goto LAB_00110288;
    if ((pQVar1 == (QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
                    *)0x0) ||
       (cVar2._M_node =
             *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10),
       (const_iterator)cVar2._M_node == pos.i._M_node)) goto LAB_0011024d;
    lVar4 = 0;
    do {
      cVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar2._M_node);
      lVar4 = lVar4 + 1;
    } while ((const_iterator)cVar2._M_node != pos.i._M_node);
  }
  detach(this);
  pos.i._M_node =
       *(const_iterator *)
        ((long)&(((this->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  if (lVar4 < 1) {
    for (; lVar4 != 0; lVar4 = lVar4 + 1) {
      pos.i._M_node = (const_iterator)std::_Rb_tree_decrement((_Rb_tree_node_base *)pos.i._M_node);
    }
  }
  else {
    do {
      pos.i._M_node = (const_iterator)std::_Rb_tree_increment((_Rb_tree_node_base *)pos.i._M_node);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
LAB_00110288:
  iVar3 = std::
          map<QByteArray,QByteArray,std::less<QByteArray>,std::allocator<std::pair<QByteArray_const,QByteArray>>>
          ::insert_or_assign<QByteArray_const&>
                    ((map<QByteArray,QByteArray,std::less<QByteArray>,std::allocator<std::pair<QByteArray_const,QByteArray>>>
                      *)&((this->d).d.ptr)->m,pos.i,key,value);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (iterator)(iterator)iVar3._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(const_iterator pos, const Key &key, const T &value)
    {
        // TODO: improve. In case of assignment, why copying first?
        typename Map::const_iterator dpos;
        const auto copy = d.isShared() ? *this : QMap(); // keep `key`/`value` alive across the detach
        if (!d || d.isShared()) {
            auto posDistance = d ? std::distance(d->m.cbegin(), pos.i) : 0;
            detach();
            dpos = std::next(d->m.cbegin(), posDistance);
        } else {
            dpos = pos.i;
        }
        return iterator(d->m.insert_or_assign(dpos, key, value));
    }